

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-splitting.cpp
# Opt level: O0

void __thiscall
wasm::ModuleSplitting::anon_unknown_0::TableSlotManager::addSlot
          (TableSlotManager *this,Name func,Slot slot)

{
  pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>
  local_58;
  TableSlotManager *local_20;
  TableSlotManager *this_local;
  Name func_local;
  
  func_local.super_IString.str._M_len = func.super_IString.str._M_str;
  this_local = func.super_IString.str._M_len;
  local_20 = this;
  std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>
  ::pair<wasm::Name_&,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot_&,_true>
            (&local_58,(Name *)&this_local,&slot);
  std::
  map<wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ModuleSplitting::(anonymous_namespace)::TableSlotManager::Slot>_>_>
  ::insert(&this->funcIndices,&local_58);
  return;
}

Assistant:

void TableSlotManager::addSlot(Name func, Slot slot) {
  // Ignore functions that already have slots.
  funcIndices.insert({func, slot});
}